

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanobenchmark.cc
# Opt level: O3

void __thiscall
highwayhash::DurationsForInputs::DurationsForInputs
          (DurationsForInputs *this,FuncInput *inputs,size_t num_inputs,size_t max_durations)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  Item *pIVar3;
  float **ppfVar4;
  ulong uVar5;
  
  this->num_items = 0;
  this->inputs_ = inputs;
  this->num_inputs_ = num_inputs;
  this->max_durations_ = max_durations;
  pfVar2 = (float *)operator_new__(-(ulong)(max_durations * num_inputs >> 0x3e != 0) |
                                   max_durations * num_inputs * 4);
  this->all_durations_ = pfVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = num_inputs;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
    uVar5 = SUB168(auVar1 * ZEXT816(0x18),0);
  }
  pIVar3 = (Item *)operator_new__(uVar5);
  this->items = pIVar3;
  if (num_inputs != 0) {
    ppfVar4 = &pIVar3->durations;
    do {
      ((Item *)(ppfVar4 + -2))->input = 0;
      ppfVar4[-1] = (float *)0x0;
      *ppfVar4 = pfVar2;
      pfVar2 = pfVar2 + max_durations;
      ppfVar4 = ppfVar4 + 3;
      num_inputs = num_inputs - 1;
    } while (num_inputs != 0);
  }
  return;
}

Assistant:

DurationsForInputs::DurationsForInputs(const FuncInput* inputs,
                                       const size_t num_inputs,
                                       const size_t max_durations)
    : num_items(0),
      inputs_(inputs),
      num_inputs_(num_inputs),
      max_durations_(max_durations),
      all_durations_(new float[num_inputs * max_durations]) {
  NANOBENCHMARK_CHECK(num_inputs != 0);
  NANOBENCHMARK_CHECK(max_durations != 0);

  items = new Item[num_inputs];
  for (size_t i = 0; i < num_inputs_; ++i) {
    items[i].input = 0;  // initialized later
    items[i].num_durations = 0;
    items[i].durations = all_durations_ + i * max_durations;
  }
}